

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O3

bool __thiscall
jsoncons::csv::detail::m_columns_filter<char,_std::allocator<char>_>::visit_string
          (m_columns_filter<char,_std::allocator<char>_> *this,string_view_type *value,
          semantic_tag tag,ser_context *param_3,error_code *param_4)

{
  semantic_tag local_9;
  
  if (this->name_index_ <
      (ulong)((long)(this->column_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->column_names_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_9 = tag;
    std::
    vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,jsoncons::semantic_tag&,std::allocator<char>&>
              ((vector<jsoncons::csv::detail::parse_event<char,std::allocator<char>>,std::allocator<jsoncons::csv::detail::parse_event<char,std::allocator<char>>>>
                *)((this->cached_events_).
                   super__Vector_base<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>,_std::allocator<jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->name_index_),value,&local_9,
               (allocator<char> *)&this->field_0x8);
    if (this->level2_ == 0) {
      this->name_index_ = this->name_index_ + 1;
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& value, semantic_tag tag, const ser_context&, std::error_code&) override
        {
            if (name_index_ < column_names_.size())
            {
                cached_events_[name_index_].emplace_back(value, tag, alloc_);

                if (level2_ == 0)
                {
                    ++name_index_;
                }
            }
            JSONCONS_VISITOR_RETURN;
        }